

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_symtab.c
# Opt level: O2

int resolve_symbolnames(dl_phdr_info *info,size_t info_size,void *data)

{
  uint uVar1;
  uint8_t header;
  uint uVar2;
  lj_wbuf *buf;
  lua_State *L;
  Elf64_Addr EVar3;
  unsigned_long_long uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  Elf64_Addr EVar8;
  ssize_t sVar9;
  FILE *__stream;
  size_t sVar10;
  void *__ptr;
  ulong uVar11;
  uint *puVar12;
  size_t sVar13;
  long lVar14;
  size_t __n;
  Elf64_Sym *pEVar15;
  size_t sVar16;
  char *pcVar17;
  size_t sVar18;
  uint uVar19;
  long lVar20;
  ulong __size;
  uint uVar21;
  int iVar22;
  long *plVar23;
  long __off;
  long lVar24;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  long lStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  char executable_path [4096];
  
  buf = *data;
  L = *(lua_State **)((long)data + 8);
  header = *(uint8_t *)((long)data + 0x10);
  memset(executable_path,0,0x1000);
  uVar4 = info->dlpi_adds;
  iVar6 = **(int **)((long)data + 0x20);
  EVar3 = info->dlpi_addr;
  EVar8 = getauxval(0x21);
  if (EVar3 == EVar8) {
    return 0;
  }
  iVar7 = (int)info->dlpi_adds;
  iVar22 = iVar7 - **(int **)((long)data + 0x20);
  *(int *)((long)data + 0x18) = iVar22;
  if (iVar22 == 0) {
    return 1;
  }
  uVar19 = *(uint *)((long)data + 0x14);
  uVar21 = (int)uVar4 - (iVar6 + iVar22);
  if (uVar19 < uVar21) goto LAB_0012caff;
  if (uVar19 == uVar21 - 1) {
    **(int **)((long)data + 0x20) = iVar7;
  }
  pcVar17 = info->dlpi_name;
  if (*pcVar17 == '\0') {
    pcVar17 = executable_path;
    sVar9 = readlink("/proc/self/exe",pcVar17,0x1000);
    if (sVar9 == -1) {
      pcVar17 = info->dlpi_name;
    }
    else {
      info->dlpi_name = pcVar17;
    }
  }
  EVar3 = info->dlpi_addr;
  local_1048 = 0;
  uStack_1040 = 0;
  local_1058 = 0;
  lStack_1050 = 0;
  local_1068 = 0;
  uStack_1060 = 0;
  local_1078 = 0;
  uStack_1070 = 0;
  __stream = fopen64(pcVar17,"rb");
  if (__stream == (FILE *)0x0) goto LAB_0012c9dd;
  sVar10 = fread(&local_1078,0x40,1,__stream);
  if (((sVar10 == 0x40) || (iVar6 = ferror(__stream), iVar6 == 0)) &&
     (lVar24 = lStack_1050, (int)local_1078 == 0x464c457f)) {
    uVar5 = uStack_1040._4_2_;
    if (uStack_1040._2_2_ != 0 && (uStack_1040._4_2_ != 0 && lStack_1050 != 0)) {
      uVar11 = (ulong)uStack_1040._4_2_;
      __size = (ulong)uStack_1040._2_2_;
      sVar10 = __size * uVar11;
      __ptr = lj_mem_realloc(L,(void *)0x0,0,(GCSize)sVar10);
      if (__ptr != (void *)0x0) {
        iVar7 = fseek(__stream,lVar24,0);
        iVar6 = -1;
        if ((iVar7 == 0) &&
           ((sVar13 = fread(__ptr,__size,uVar11,__stream), sVar13 == sVar10 ||
            (iVar7 = ferror(__stream), iVar7 == 0)))) {
          sVar13 = 0;
          lVar24 = 0;
          do {
            lVar14 = lVar24;
            if ((ulong)uVar5 * 0x40 + 0x40 == lVar14 + 0x40) {
              __n = 0;
              __off = 0;
              lVar24 = 0;
              goto LAB_0012cb99;
            }
            lVar24 = lVar14 + 0x40;
          } while (*(int *)((long)__ptr + lVar14 + 4) != 2);
          lVar24 = *(long *)((long)__ptr + lVar14 + 0x18);
          lVar20 = (ulong)*(uint *)((long)__ptr + lVar14 + 0x28) * 0x40;
          __off = *(long *)((long)__ptr + lVar20 + 0x18);
          sVar13 = *(size_t *)((long)__ptr + lVar20 + 0x20);
          __n = *(ulong *)((long)__ptr + lVar14 + 0x20) / *(ulong *)((long)__ptr + lVar14 + 0x38);
LAB_0012cb99:
          if (((lVar24 != 0) && (__off != 0)) && (__n != 0)) {
            sVar18 = __n * 0x18;
            pEVar15 = (Elf64_Sym *)lj_mem_realloc(L,(void *)0x0,0,(GCSize)sVar18);
            if (pEVar15 != (Elf64_Sym *)0x0) {
              iVar7 = fseek(__stream,lVar24,0);
              iVar6 = -1;
              if (iVar7 == 0) {
                sVar16 = fread(pEVar15,0x18,__n,__stream);
                if (((sVar16 == sVar18) || (iVar7 = ferror(__stream), iVar7 == 0)) &&
                   (pcVar17 = (char *)lj_mem_realloc(L,(void *)0x0,0,(GCSize)sVar13),
                   pcVar17 != (char *)0x0)) {
                  iVar7 = fseek(__stream,__off,0);
                  if ((iVar7 == 0) &&
                     ((sVar16 = fread(pcVar17,1,sVar13,__stream), sVar16 == sVar13 ||
                      (iVar7 = ferror(__stream), iVar7 == 0)))) {
                    write_c_symtab(pEVar15,pcVar17,EVar3,__n,header,buf);
                    iVar6 = 0;
                  }
                }
                else {
                  pcVar17 = (char *)0x0;
                }
              }
              else {
                pcVar17 = (char *)0x0;
              }
              uVar11 = (ulong)(L->glref).ptr32;
              *(int *)(uVar11 + 0x50) = *(int *)(uVar11 + 0x50) - (GCSize)sVar18;
              *(long *)(uVar11 + 0x90) = *(long *)(uVar11 + 0x90) + sVar18;
              (**(code **)(uVar11 + 0x40))(*(undefined8 *)(uVar11 + 0x48),pEVar15,sVar18,0);
              if (pcVar17 != (char *)0x0) {
                uVar11 = (ulong)(L->glref).ptr32;
                *(int *)(uVar11 + 0x50) = *(int *)(uVar11 + 0x50) - (GCSize)sVar13;
                *(long *)(uVar11 + 0x90) = *(long *)(uVar11 + 0x90) + sVar13;
                (**(code **)(uVar11 + 0x40))(*(undefined8 *)(uVar11 + 0x48),pcVar17,sVar13,0);
              }
            }
          }
        }
        uVar11 = (ulong)(L->glref).ptr32;
        *(int *)(uVar11 + 0x50) = *(int *)(uVar11 + 0x50) - (GCSize)sVar10;
        *(long *)(uVar11 + 0x90) = *(long *)(uVar11 + 0x90) + sVar10;
        (**(code **)(uVar11 + 0x40))(*(undefined8 *)(uVar11 + 0x48),__ptr,sVar10);
        fclose(__stream);
        if (iVar6 != 0) goto LAB_0012c9dd;
        goto LAB_0012cafb;
      }
    }
  }
  fclose(__stream);
LAB_0012c9dd:
  lVar24 = 0;
  do {
    lVar14 = lVar24;
    if ((ulong)info->dlpi_phnum * 0x38 + 0x38 == lVar14 + 0x38) goto LAB_0012ca9c;
    lVar24 = lVar14 + 0x38;
  } while (*(int *)((long)&info->dlpi_phdr->p_type + lVar14) != 2);
  plVar23 = (long *)(*(long *)((long)&info->dlpi_phdr->p_vaddr + lVar14) + info->dlpi_addr + 8);
  pEVar15 = (Elf64_Sym *)0x0;
  lVar24 = 0;
  puVar12 = (uint *)0x0;
  pcVar17 = (char *)0x0;
  do {
    switch(plVar23[-1]) {
    case 0:
      goto switchD_0012ca39_caseD_0;
    case 1:
    case 2:
    case 3:
      break;
    case 4:
      lVar24 = *plVar23;
      break;
    case 5:
      pcVar17 = (char *)*plVar23;
      break;
    case 6:
      pEVar15 = (Elf64_Sym *)*plVar23;
      break;
    default:
      if (plVar23[-1] == 0x6ffffef5) {
        puVar12 = (uint *)*plVar23;
      }
    }
    plVar23 = plVar23 + 2;
  } while( true );
switchD_0012ca39_caseD_0:
  if (((lVar24 == 0 && puVar12 == (uint *)0x0) || (pcVar17 == (char *)0x0)) ||
     (pEVar15 == (Elf64_Sym *)0x0)) {
LAB_0012ca9c:
    lj_wbuf_addbyte(buf,'\x01');
    lj_wbuf_addu64(buf,info->dlpi_addr);
    lj_wbuf_addstring(buf,info->dlpi_name);
  }
  else {
    if (puVar12 == (uint *)0x0) {
      uVar19 = *(uint *)(lVar24 + 4);
    }
    else {
      uVar21 = 0;
      for (lVar24 = 0; *puVar12 != (uint)lVar24; lVar24 = lVar24 + 1) {
        if (uVar21 <= puVar12[(ulong)puVar12[2] * 2 + lVar24 + 4]) {
          uVar21 = puVar12[(ulong)puVar12[2] * 2 + lVar24 + 4];
        }
      }
      uVar2 = puVar12[1];
      uVar19 = uVar2;
      if (uVar2 <= uVar21) {
        do {
          uVar1 = uVar21 - uVar2;
          uVar21 = uVar21 + 1;
          uVar19 = uVar21;
        } while ((puVar12[(ulong)puVar12[2] * 2 + (ulong)*puVar12 + (ulong)uVar1 + 4] & 1) == 0);
      }
    }
    write_c_symtab(pEVar15,pcVar17,info->dlpi_addr,(ulong)uVar19,header,buf);
  }
LAB_0012cafb:
  uVar19 = *(uint *)((long)data + 0x14);
LAB_0012caff:
  *(uint *)((long)data + 0x14) = uVar19 + 1;
  return 0;
}

Assistant:

static int resolve_symbolnames(struct dl_phdr_info *info, size_t info_size,
			       void *data)
{
  struct symbol_resolver_conf *conf = data;
  struct lj_wbuf *buf = conf->buf;
  lua_State *L = conf->L;
  const uint8_t header = conf->header;
  char executable_path[PATH_MAX] = {0};

  uint32_t lib_cnt = 0;

  /*
  ** Check that dlpi_adds and dlpi_subs fields are available.
  ** Assertion was taken from the GLIBC tests:
  ** https://code.woboq.org/userspace/glibc/elf/tst-dlmodcount.c.html#37
  */
  lj_assertL(info_size > offsetof(struct dl_phdr_info, dlpi_subs)
			 + sizeof(info->dlpi_subs),
	     "bad dlpi_subs");

  lib_cnt = info->dlpi_adds - *conf->lib_adds;

  /* Skip vDSO library. */
  if (info->dlpi_addr == getauxval(AT_SYSINFO_EHDR))
    return 0;

  if ((conf->to_dump_cnt = info->dlpi_adds - *conf->lib_adds) == 0)
    /* No new libraries, stop resolver. */
    return 1;

  if (conf->cur_lib < lib_cnt - conf->to_dump_cnt) {
    /* That lib is already dumped, skip it. */
    ++conf->cur_lib;
    return 0;
  }

  if (conf->cur_lib == lib_cnt - conf->to_dump_cnt - 1)
    /* Last library, update memrpof's lib counter. */
    *conf->lib_adds = info->dlpi_adds;

  /*
  ** The `dl_iterate_phdr` returns an empty string as a name for
  ** the executable from which it was called. It is still possible
  ** to access its dynamic symbol table, but it is vital for
  ** sysprof to obtain the main symbol table for the LuaJIT
  ** executable. To do so, we need a valid path to the executable.
  ** Since there is no way to obtain the path to a running
  ** executable using the C standard library, the only more or
  ** less reliable way to do this is by reading the symbolic link
  ** from `/proc/self/exe`. Most of the UNIX-based systems have
  ** procfs, so it is not a problem.
  ** Such path tweaks relate only for the main way (see below).
  */
  if (*info->dlpi_name == '\0') {
    if (readlink("/proc/self/exe", executable_path, PATH_MAX) != -1)
      info->dlpi_name = executable_path;
    else
      /*
      ** It is impossible for sysprof to work properly without the
      ** LuaJIT's .symtab section present. The assertion below is
      ** unlikely to be triggered on any system supported by
      ** sysprof, unless someone have deleted the LuaJIT binary
      ** right after the start.
      */
      lj_assertL(0, "bad executed binary symtab section");
  }

  /*
  ** Main way: try to open ELF and read SHT_SYMTAB, SHT_STRTAB and SHT_HASH
  ** sections from it.
  */
  if (dump_sht_symtab(info->dlpi_name, buf, L, header, info->dlpi_addr) == 0) {
    ++conf->cur_lib;
  }
  /* First fallback: dump functions only from PT_DYNAMIC segment. */
  else if(dump_dyn_symtab(info, header, buf) == 0) {
    ++conf->cur_lib;
  }
  /*
  ** Last resort: dump ELF size and address to show .so name for its functions
  ** in memprof output.
  */
  else {
    lj_wbuf_addbyte(buf, SYMTAB_CFUNC);
    lj_wbuf_addu64(buf, info->dlpi_addr);
    lj_wbuf_addstring(buf, info->dlpi_name);
    ++conf->cur_lib;
  }

  return 0;
}